

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::GlobalReplaceSubstring(string *substring,string *replacement,string *s)

{
  string *psVar1;
  int iVar2;
  LogMessage *other;
  ulong uVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  long local_a8;
  size_type match_pos;
  int pos;
  int num_replacements;
  string tmp;
  LogMessage local_60;
  string *local_28;
  string *s_local;
  string *replacement_local;
  string *substring_local;
  
  local_28 = s;
  s_local = replacement;
  replacement_local = substring;
  if (s == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x650);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: s != nullptr: ");
    internal::LogFinisher::operator=((LogFinisher *)(tmp.field_2._M_local_buf + 0xb),other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    std::__cxx11::string::string((string *)&pos);
    psVar1 = local_28;
    match_pos._4_4_ = 0;
    match_pos._0_4_ = 0;
    uVar3 = std::__cxx11::string::data();
    std::__cxx11::string::length();
    local_a8 = std::__cxx11::string::find((char *)psVar1,uVar3,0);
    while (psVar1 = local_28, local_a8 != -1) {
      match_pos._4_4_ = match_pos._4_4_ + 1;
      std::__cxx11::string::append((string *)&pos,(ulong)local_28,(long)(int)match_pos);
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&pos,__first,__last);
      iVar2 = std::__cxx11::string::length();
      psVar1 = local_28;
      match_pos._0_4_ = (int)local_a8 + iVar2;
      uVar3 = std::__cxx11::string::data();
      std::__cxx11::string::length();
      local_a8 = std::__cxx11::string::find((char *)psVar1,uVar3,(long)(int)match_pos);
    }
    if (0 < match_pos._4_4_) {
      std::__cxx11::string::length();
      std::__cxx11::string::append((string *)&pos,(ulong)psVar1,(long)(int)match_pos);
      std::__cxx11::string::swap((string *)local_28);
    }
    substring_local._4_4_ = match_pos._4_4_;
    std::__cxx11::string::~string((string *)&pos);
  }
  else {
    substring_local._4_4_ = 0;
  }
  return substring_local._4_4_;
}

Assistant:

int GlobalReplaceSubstring(const std::string &substring,
                           const std::string &replacement, std::string *s) {
  GOOGLE_CHECK(s != nullptr);
  if (s->empty() || substring.empty())
    return 0;
  std::string tmp;
  int num_replacements = 0;
  int pos = 0;
  for (StringPiece::size_type match_pos =
           s->find(substring.data(), pos, substring.length());
       match_pos != std::string::npos; pos = match_pos + substring.length(),
                              match_pos = s->find(substring.data(), pos,
                                                  substring.length())) {
    ++num_replacements;
    // Append the original content before the match.
    tmp.append(*s, pos, match_pos - pos);
    // Append the replacement for the match.
    tmp.append(replacement.begin(), replacement.end());
  }
  // Append the content after the last match. If no replacements were made, the
  // original string is left untouched.
  if (num_replacements > 0) {
    tmp.append(*s, pos, s->length() - pos);
    s->swap(tmp);
  }
  return num_replacements;
}